

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

int MD5_Update(MD5_CTX *c,void *data,size_t len)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  uint *__dest;
  ulong __n;
  
  uVar1 = c->A;
  uVar3 = uVar1 + (int)len & 0x1fffffff;
  c->A = uVar3;
  if (uVar3 < uVar1) {
    c->B = c->B + 1;
  }
  c->B = c->B + ((uint)(len >> 0x1d) & 7);
  if ((uVar1 & 0x3f) != 0) {
    __n = 0x40 - ((ulong)uVar1 & 0x3f);
    __dest = (uint *)((long)c->data + ((ulong)uVar1 & 0x3f));
    if (len < __n) goto LAB_0058fe2f;
    memcpy(__dest,data,__n);
    data = (void *)((long)data + __n);
    body((MD5_CTX *)c,c->data,0x40);
    len = len - __n;
  }
  if (0x3f < len) {
    data = body((MD5_CTX *)c,data,len & 0xffffffffffffffc0);
    len = (size_t)((uint)len & 0x3f);
  }
  __dest = c->data;
LAB_0058fe2f:
  pvVar2 = memcpy(__dest,data,len);
  return (int)pvVar2;
}

Assistant:

static void MD5_Update(MD5_CTX *ctx, const void *data, unsigned long size)
{
  MD5_u32plus saved_lo;
  unsigned long used, available;

  saved_lo = ctx->lo;
  if((ctx->lo = (saved_lo + size) & 0x1fffffff) < saved_lo)
    ctx->hi++;
  ctx->hi += (MD5_u32plus)size >> 29;

  used = saved_lo & 0x3f;

  if(used) {
    available = 64 - used;

    if(size < available) {
      memcpy(&ctx->buffer[used], data, size);
      return;
    }

    memcpy(&ctx->buffer[used], data, available);
    data = (const unsigned char *)data + available;
    size -= available;
    body(ctx, ctx->buffer, 64);
  }

  if(size >= 64) {
    data = body(ctx, data, size & ~(unsigned long)0x3f);
    size &= 0x3f;
  }

  memcpy(ctx->buffer, data, size);
}